

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void wb_write_uniform(aom_write_bit_buffer *wb,int n,int v)

{
  int bits;
  int iVar1;
  
  bits = 0x1f;
  if (n != 0) {
    for (; (uint)n >> bits == 0; bits = bits + -1) {
    }
  }
  if (n == 0) {
    return;
  }
  iVar1 = (1 << (-((byte)bits ^ 0x1f) & 0x1f)) - n;
  if (iVar1 <= v) {
    aom_wb_write_literal(wb,(v - iVar1 >> 1) + iVar1,bits);
    v = v - iVar1 & 1;
    bits = 1;
  }
  aom_wb_write_literal(wb,v,bits);
  return;
}

Assistant:

static inline void wb_write_uniform(struct aom_write_bit_buffer *wb, int n,
                                    int v) {
  const int l = get_unsigned_bits(n);
  const int m = (1 << l) - n;
  if (l == 0) return;
  if (v < m) {
    aom_wb_write_literal(wb, v, l - 1);
  } else {
    aom_wb_write_literal(wb, m + ((v - m) >> 1), l - 1);
    aom_wb_write_literal(wb, (v - m) & 1, 1);
  }
}